

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<double>::Set(RepeatedField<double> *this,int index,double *value)

{
  LogMessage *pLVar1;
  double *pdVar2;
  LogMessage local_70;
  double local_38;
  LogFinisher local_29;
  
  if (index < 0) {
    internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/repeated_field.h"
               ,0x52c);
    pLVar1 = internal::LogMessage::operator<<(&local_70,"CHECK failed: (index) >= (0): ");
    internal::LogFinisher::operator=(&local_29,pLVar1);
    internal::LogMessage::~LogMessage(&local_70);
  }
  if (this->current_size_ <= index) {
    internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/repeated_field.h"
               ,0x52d);
    pLVar1 = internal::LogMessage::operator<<(&local_70,"CHECK failed: (index) < (current_size_): ")
    ;
    internal::LogFinisher::operator=(&local_29,pLVar1);
    internal::LogMessage::~LogMessage(&local_70);
  }
  local_38 = *value;
  pdVar2 = elements(this);
  pdVar2[index] = local_38;
  return;
}

Assistant:

inline void RepeatedField<Element>::Set(int index, const Element& value) {
  GOOGLE_DCHECK_GE(index, 0);
  GOOGLE_DCHECK_LT(index, current_size_);
  elements()[index] = value;
}